

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseRegisterTable
          (MipsParser *this,Parser *parser,MipsRegisterValue *dest,MipsRegisterDescriptor *table,
          size_t count)

{
  TokenType TVar1;
  char *__s;
  bool bVar2;
  Token *pTVar3;
  Identifier *this_00;
  size_t sVar4;
  long lVar5;
  MipsRegisterDescriptor *pMVar6;
  string_view other;
  
  bVar2 = false;
  pTVar3 = Parser::peekToken(parser,0);
  TVar1 = pTVar3->type;
  pTVar3 = Parser::peekToken(parser,(uint)(TVar1 == Dollar));
  if (pTVar3->type == Identifier) {
    this_00 = Token::identifierValue(pTVar3);
    lVar5 = count + 1;
    do {
      pMVar6 = table;
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        return false;
      }
      __s = pMVar6->name;
      sVar4 = strlen(__s);
      other._M_str = __s;
      other._M_len = sVar4;
      bVar2 = Identifier::operator==(this_00,other);
      table = pMVar6 + 1;
    } while (!bVar2);
    std::__cxx11::string::_M_assign((string *)&dest->name);
    dest->num = pMVar6->num;
    Parser::eatTokens(parser,(TVar1 == Dollar) + 1);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool MipsParser::parseRegisterTable(Parser& parser, MipsRegisterValue& dest, const MipsRegisterDescriptor* table, size_t count)
{
	int offset = 0;
	bool hasDollar = parser.peekToken().type == TokenType::Dollar;
	if (hasDollar)
		offset = 1;

	const Token &token = parser.peekToken(offset);

	if (token.type != TokenType::Identifier)
		return false;

	const auto &identifier = token.identifierValue();
	for (size_t i = 0; i < count; i++)
	{
		if (identifier == table[i].name)
		{
			dest.name = identifier;
			dest.num = table[i].num;
			parser.eatTokens(hasDollar ? 2 : 1);
			return true;
		}
	}

	return false;
}